

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLoad.c
# Opt level: O3

void Abc_SclComputeLoad(SC_Man *p)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  void **ppvVar6;
  void *pvVar7;
  SC_Pair *pSVar8;
  long *plVar9;
  long lVar10;
  SC_WireLoad *pWL;
  int iVar11;
  Vec_Flt_t *pVVar12;
  Vec_Ptr_t *pVVar13;
  long lVar14;
  long lVar15;
  Abc_Ntk_t *pNtk;
  ulong uVar16;
  long lVar17;
  float fVar18;
  SC_Pair SVar19;
  SC_Pair SVar20;
  SC_Pair SVar21;
  SC_Pair SVar22;
  
  pNtk = p->pNtk;
  pVVar13 = pNtk->vObjs;
  iVar11 = pVVar13->nSize;
  lVar14 = (long)iVar11;
  if (0 < lVar14) {
    ppvVar6 = pVVar13->pArray;
    lVar15 = 0;
    do {
      pvVar7 = ppvVar6[lVar15];
      if ((pvVar7 != (void *)0x0) && ((*(uint *)((long)pvVar7 + 0x14) & 0xf) != 3)) {
        pSVar8 = p->pLoads;
        uVar2 = *(uint *)((long)pvVar7 + 0x10);
        pSVar8[uVar2].rise = 0.0;
        pSVar8[uVar2].fall = 0.0;
      }
      lVar15 = lVar15 + 1;
    } while (lVar14 != lVar15);
    if (0 < iVar11) {
      ppvVar6 = pVVar13->pArray;
      lVar15 = 0;
      do {
        plVar9 = (long *)ppvVar6[lVar15];
        if ((plVar9 != (long *)0x0) && ((*(uint *)((long)plVar9 + 0x14) & 0xf) == 7)) {
          uVar2 = *(uint *)((long)plVar9 + 0x1c);
          if ((ulong)uVar2 != 0) {
            iVar5 = (int)plVar9[2];
            if ((long)iVar5 < 0) {
LAB_004750f4:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            lVar10 = *plVar9;
            if (*(int *)(*(long *)(lVar10 + 0x178) + 4) <= iVar5) goto LAB_004750f4;
            uVar3 = *(uint *)(*(long *)(*(long *)(lVar10 + 0x178) + 8) + (long)iVar5 * 4);
            if ((ulong)uVar3 == 0xffffffff) {
              lVar17 = 0;
            }
            else {
              if (((int)uVar3 < 0) || (*(int *)(*(long *)(lVar10 + 0x170) + 100) <= (int)uVar3)) {
LAB_004750b6:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              lVar17 = *(long *)(*(long *)(*(long *)(lVar10 + 0x170) + 0x68) + (ulong)uVar3 * 8);
            }
            if (0 < (int)uVar2) {
              uVar3 = *(uint *)(lVar17 + 0x34);
              if ((int)*(uint *)(lVar17 + 0x34) < 1) {
                uVar3 = 0;
              }
              uVar16 = 0;
              do {
                if (uVar3 == uVar16) goto LAB_004750b6;
                uVar4 = *(uint *)(*(long *)(*(long *)(*(long *)(lVar10 + 0x20) + 8) +
                                           (long)*(int *)(plVar9[4] + uVar16 * 4) * 8) + 0x10);
                uVar1 = *(undefined8 *)(*(long *)(*(long *)(lVar17 + 0x38) + uVar16 * 8) + 0x10);
                SVar22 = p->pLoads[uVar4];
                SVar21.rise = SVar22.rise + (float)uVar1;
                SVar21.fall = SVar22.fall + (float)((ulong)uVar1 >> 0x20);
                p->pLoads[uVar4] = SVar21;
                uVar16 = uVar16 + 1;
              } while (uVar2 != uVar16);
            }
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != lVar14);
    }
  }
  lVar14 = (long)pNtk->vCos->nSize;
  if (0 < lVar14) {
    ppvVar6 = pNtk->vCos->pArray;
    pSVar8 = p->pLoads;
    lVar15 = 0;
    do {
      plVar9 = (long *)ppvVar6[lVar15];
      uVar2 = *(uint *)(*(long *)(*(long *)(*(long *)(*plVar9 + 0x20) + 8) +
                                 (long)*(int *)plVar9[4] * 8) + 0x10);
      SVar22.rise = pSVar8[uVar2].rise + pSVar8[*(uint *)(plVar9 + 2)].rise;
      SVar22.fall = pSVar8[uVar2].fall + pSVar8[*(uint *)(plVar9 + 2)].fall;
      pSVar8[uVar2] = SVar22;
      lVar15 = lVar15 + 1;
    } while (lVar14 != lVar15);
  }
  pWL = p->pWLoadUsed;
  if (pWL != (SC_WireLoad *)0x0) {
    if (p->vWireCaps == (Vec_Flt_t *)0x0) {
      iVar11 = Abc_NtkGetFanoutMax(pNtk);
      pVVar12 = Abc_SclFindWireCaps(pWL,iVar11);
      p->vWireCaps = pVVar12;
      pNtk = p->pNtk;
      pVVar13 = pNtk->vObjs;
      iVar11 = pVVar13->nSize;
    }
    if (0 < iVar11) {
      lVar14 = 0;
      do {
        pvVar7 = pVVar13->pArray[lVar14];
        if (((pvVar7 != (void *)0x0) && ((*(uint *)((long)pvVar7 + 0x14) & 0xf) == 7)) &&
           (*(int *)((long)pvVar7 + 0x1c) != 0)) {
          fVar18 = Abc_SclFindWireLoad(p->vWireCaps,*(int *)((long)pvVar7 + 0x2c));
          SVar22 = p->pLoads[*(uint *)((long)pvVar7 + 0x10)];
          SVar19.rise = fVar18 + SVar22.rise;
          SVar19.fall = fVar18 + SVar22.fall;
          p->pLoads[*(uint *)((long)pvVar7 + 0x10)] = SVar19;
          pNtk = p->pNtk;
        }
        lVar14 = lVar14 + 1;
        pVVar13 = pNtk->vObjs;
      } while (lVar14 < pVVar13->nSize);
    }
    pVVar13 = pNtk->vPis;
    if (0 < pVVar13->nSize) {
      lVar14 = 0;
      do {
        pvVar7 = pVVar13->pArray[lVar14];
        fVar18 = Abc_SclFindWireLoad(p->vWireCaps,*(int *)((long)pvVar7 + 0x2c));
        uVar2 = *(uint *)((long)pvVar7 + 0x10);
        SVar22 = p->pLoads[uVar2];
        SVar20.rise = fVar18 + SVar22.rise;
        SVar20.fall = fVar18 + SVar22.fall;
        p->pLoads[uVar2] = SVar20;
        lVar14 = lVar14 + 1;
        pNtk = p->pNtk;
        pVVar13 = pNtk->vPis;
      } while (lVar14 < pVVar13->nSize);
    }
  }
  if ((p->vInDrive != (Vec_Flt_t *)0x0) && (pVVar13 = pNtk->vPis, 0 < pVVar13->nSize)) {
    lVar14 = 0;
    do {
      iVar11 = *(int *)((long)pVVar13->pArray[lVar14] + 0x38);
      if (((long)iVar11 < 0) || (p->vInDrive->nSize <= iVar11)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                      ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
      }
      fVar18 = p->vInDrive->pArray[iVar11];
      if ((fVar18 != 0.0) || (NAN(fVar18))) {
        uVar2 = *(uint *)((long)pVVar13->pArray[lVar14] + 0x10);
        if ((fVar18 < p->pLoads[uVar2].rise) || (fVar18 < p->pLoads[uVar2].fall)) {
          printf("Maximum input drive strength is exceeded at primary input %d.\n");
          pNtk = p->pNtk;
        }
      }
      lVar14 = lVar14 + 1;
      pVVar13 = pNtk->vPis;
    } while (lVar14 < pVVar13->nSize);
  }
  lVar14 = (long)pNtk->vObjs->nSize;
  if (lVar14 < 1) {
    iVar11 = 0;
    fVar18 = 0.0;
  }
  else {
    fVar18 = 0.0;
    lVar15 = 0;
    iVar11 = 0;
    do {
      pvVar7 = pNtk->vObjs->pArray[lVar15];
      if (((pvVar7 != (void *)0x0) && ((*(uint *)((long)pvVar7 + 0x14) & 0xf) == 7)) &&
         (*(int *)((long)pvVar7 + 0x1c) != 0)) {
        fVar18 = fVar18 + p->pLoads[*(uint *)((long)pvVar7 + 0x10)].fall * 0.5 +
                          p->pLoads[*(uint *)((long)pvVar7 + 0x10)].rise * 0.5;
        iVar11 = iVar11 + 1;
      }
      lVar15 = lVar15 + 1;
    } while (lVar14 != lVar15);
  }
  iVar5 = pNtk->vPis->nSize;
  if (0 < (long)iVar5) {
    lVar14 = 0;
    do {
      uVar2 = *(uint *)((long)pNtk->vPis->pArray[lVar14] + 0x10);
      fVar18 = fVar18 + p->pLoads[uVar2].fall * 0.5 + p->pLoads[uVar2].rise * 0.5;
      lVar14 = lVar14 + 1;
    } while (iVar5 != lVar14);
    iVar11 = iVar11 + iVar5;
  }
  p->EstLoadAve = fVar18 / (float)iVar11;
  return;
}

Assistant:

void Abc_SclComputeLoad( SC_Man * p )
{
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    // clear load storage
    Abc_NtkForEachObj( p->pNtk, pObj, i )
    {
        SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
        if ( !Abc_ObjIsPo(pObj) )
            pLoad->rise = pLoad->fall = 0.0;
    }
    // add cell load
    Abc_NtkForEachNode1( p->pNtk, pObj, i )
    {
        SC_Cell * pCell = Abc_SclObjCell( pObj );
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            SC_Pair * pLoad = Abc_SclObjLoad( p, pFanin );
            SC_Pin * pPin = SC_CellPin( pCell, k );
            pLoad->rise += pPin->rise_cap;
            pLoad->fall += pPin->fall_cap;
        }
    }
    // add PO load
    Abc_NtkForEachCo( p->pNtk, pObj, i )
    {
        SC_Pair * pLoadPo = Abc_SclObjLoad( p, pObj );
        SC_Pair * pLoad = Abc_SclObjLoad( p, Abc_ObjFanin0(pObj) );
        pLoad->rise += pLoadPo->rise;
        pLoad->fall += pLoadPo->fall;
    }
    // add wire load
    if ( p->pWLoadUsed != NULL )
    {
        if ( p->vWireCaps == NULL )
            p->vWireCaps = Abc_SclFindWireCaps( p->pWLoadUsed, Abc_NtkGetFanoutMax(p->pNtk) );
        Abc_NtkForEachNode1( p->pNtk, pObj, i )
            Abc_SclAddWireLoad( p, pObj, 0 );
        Abc_NtkForEachPi( p->pNtk, pObj, i )
            Abc_SclAddWireLoad( p, pObj, 0 );
    }
    // check input loads
    if ( p->vInDrive != NULL )
    {
        Abc_NtkForEachPi( p->pNtk, pObj, i )
        {
            SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
            if ( Abc_SclObjInDrive(p, pObj) != 0 && (pLoad->rise > Abc_SclObjInDrive(p, pObj) || pLoad->fall > Abc_SclObjInDrive(p, pObj)) )
                printf( "Maximum input drive strength is exceeded at primary input %d.\n", i );
        }
    }
/*
    // transfer load from barbufs
    Abc_NtkForEachBarBuf( p->pNtk, pObj, i )
    {
        SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
        SC_Pair * pLoadF = Abc_SclObjLoad( p, Abc_ObjFanin(pObj, 0) );
        SC_PairAdd( pLoadF, pLoad );
    }
*/
    // calculate average load
//    if ( p->EstLoadMax )
    {
        double TotalLoad = 0;
        int nObjs = 0;
        Abc_NtkForEachNode1( p->pNtk, pObj, i )
        {
            SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
            TotalLoad += 0.5 * pLoad->fall + 0.5 * pLoad->rise;
            nObjs++;
        }
        Abc_NtkForEachPi( p->pNtk, pObj, i )
        {
            SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
            TotalLoad += 0.5 * pLoad->fall + 0.5 * pLoad->rise;
            nObjs++;
        }
        p->EstLoadAve = (float)(TotalLoad / nObjs);
//        printf( "Average load = %.2f\n", p->EstLoadAve );
    }
}